

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O2

void __thiscall
wasm::Memory64Lowering::visitDataSegment(Memory64Lowering *this,DataSegment *segment)

{
  Module *this_00;
  Expression *pEVar1;
  pointer puVar2;
  char *pcVar3;
  Type type;
  pointer puVar4;
  Memory *pMVar5;
  int64_t iVar6;
  Global *pGVar7;
  Builder curr;
  Const *pCVar8;
  Name base;
  Name name;
  undefined1 local_c0 [8];
  ImportInfo info;
  Builder builder;
  
  if (segment->isPassive == false) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    pMVar5 = Module::getMemory(this_00,(Name)(segment->memory).super_IString.str);
    if ((pMVar5->addressType).id == 3) {
      pEVar1 = segment->offset;
      if (pEVar1->_id == GlobalGetId) {
        pGVar7 = Module::getGlobal(this_00,(Name)pEVar1[1]);
        if (((pGVar7->super_Importable).module.super_IString.str._M_str != (char *)0x0) &&
           ((pGVar7->super_Importable).base.super_IString.str._M_str == (char *)MEMORY_BASE._8_8_))
        {
          ImportInfo::ImportInfo((ImportInfo *)local_c0,this_00);
          base.super_IString.str._M_str = (char *)DAT_01175ba8.id;
          base.super_IString.str._M_len = (size_t)MEMORY_BASE32;
          curr.wasm = (Module *)
                      ImportInfo::getImportedGlobal
                                ((ImportInfo *)local_c0,
                                 (Name)(pGVar7->super_Importable).module.super_IString.str,base);
          type.id = DAT_01175ba8.id;
          puVar2 = MEMORY_BASE32;
          if (curr.wasm == (Module *)0x0) {
            info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
            pCVar8 = Builder::makeConst<int>
                               ((Builder *)
                                &info.importedTags.
                                 super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            name.super_IString.str._M_str = (char *)puVar2;
            name.super_IString.str._M_len = (size_t)&builder;
            Builder::makeGlobal(name,type,(Expression *)0x2,(Mutability)pCVar8);
            curr = builder;
            builder.wasm = (Module *)0x0;
            std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                      ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
            puVar2 = (pointer)(pGVar7->super_Importable).module.super_IString.str._M_str;
            ((curr.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(pGVar7->super_Importable).module.super_IString.str._M_len;
            ((curr.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = puVar2;
            puVar4 = (pointer)DAT_01175ba8.id;
            ((curr.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = MEMORY_BASE32;
            ((curr.wasm)->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = puVar4;
            Module::addGlobal(this_00,(Global *)curr.wasm);
          }
          (pEVar1->type).id = 2;
          pcVar3 = (((Importable *)&(curr.wasm)->exports)->super_Named).name.super_IString.str.
                   _M_str;
          *(size_t *)(pEVar1 + 1) =
               (((Importable *)&(curr.wasm)->exports)->super_Named).name.super_IString.str._M_len;
          pEVar1[1].type.id = (uintptr_t)pcVar3;
          ImportInfo::~ImportInfo((ImportInfo *)local_c0);
        }
      }
      else {
        if (pEVar1->_id != ConstId) {
          handle_unreachable("unexpected elem offset",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                             ,0xc9);
        }
        iVar6 = Literal::geti64((Literal *)(pEVar1 + 1));
        local_c0._0_4_ = (undefined4)iVar6;
        info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
        Literal::operator=((Literal *)(pEVar1 + 1),(Literal *)local_c0);
        Literal::~Literal((Literal *)local_c0);
        (pEVar1->type).id = 2;
      }
    }
  }
  return;
}

Assistant:

void visitDataSegment(DataSegment* segment) {
    auto& module = *getModule();

    // passive segments don't have any offset to adjust
    if (segment->isPassive || !module.getMemory(segment->memory)->is64()) {
      return;
    }

    if (auto* c = segment->offset->dynCast<Const>()) {
      c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
      c->type = Type::i32;
    } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
      auto* g = module.getGlobal(get->name);
      if (g->imported() && g->base == MEMORY_BASE) {
        ImportInfo info(module);
        auto* memoryBase32 = info.getImportedGlobal(g->module, MEMORY_BASE32);
        if (!memoryBase32) {
          Builder builder(module);
          memoryBase32 = builder
                           .makeGlobal(MEMORY_BASE32,
                                       Type::i32,
                                       builder.makeConst(int32_t(0)),
                                       Builder::Immutable)
                           .release();
          memoryBase32->module = g->module;
          memoryBase32->base = MEMORY_BASE32;
          module.addGlobal(memoryBase32);
        }
        // Use this alternative import when initializing the segment.
        assert(memoryBase32);
        get->type = Type::i32;
        get->name = memoryBase32->name;
      }
    } else {
      WASM_UNREACHABLE("unexpected elem offset");
    }
  }